

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

int add_not_list_to_class
              (uint8_t *classbits,PCRE2_UCHAR8 **uchardptr,uint32_t options,compile_block_8 *cb,
              uint32_t *p)

{
  int iVar1;
  uint32_t local_64;
  int local_38;
  int n8;
  BOOL utf;
  uint32_t *p_local;
  compile_block_8 *cb_local;
  uint32_t options_local;
  PCRE2_UCHAR8 **uchardptr_local;
  uint8_t *classbits_local;
  
  local_38 = 0;
  _n8 = p;
  if (*p != 0) {
    local_38 = add_to_class(classbits,uchardptr,options,cb,0,*p - 1);
  }
  for (; *_n8 != 0xffffffff; _n8 = _n8 + 1) {
    for (; _n8[1] == *_n8 + 1; _n8 = _n8 + 1) {
    }
    if (_n8[1] == 0xffffffff) {
      local_64 = 0xffffffff;
      if ((options & 0x80000) != 0) {
        local_64 = 0x10ffff;
      }
    }
    else {
      local_64 = _n8[1] - 1;
    }
    iVar1 = add_to_class(classbits,uchardptr,options,cb,*_n8 + 1,local_64);
    local_38 = iVar1 + local_38;
  }
  return local_38;
}

Assistant:

static int
add_not_list_to_class(uint8_t *classbits, PCRE2_UCHAR **uchardptr,
  uint32_t options, compile_block *cb, const uint32_t *p)
{
BOOL utf = (options & PCRE2_UTF) != 0;
int n8 = 0;
if (p[0] > 0)
  n8 += add_to_class(classbits, uchardptr, options, cb, 0, p[0] - 1);
while (p[0] < NOTACHAR)
  {
  while (p[1] == p[0] + 1) p++;
  n8 += add_to_class(classbits, uchardptr, options, cb, p[0] + 1,
    (p[1] == NOTACHAR) ? (utf ? 0x10ffffu : 0xffffffffu) : p[1] - 1);
  p++;
  }
return n8;
}